

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpAcceptSubscription
              (UpnpDevice_Handle Hnd,char *DevID_const,char *ServName_const,char **VarName_const,
              char **NewVal_const,int cVariables,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  char **NewVal;
  char **VarName;
  char *ServName;
  char *DevID;
  Handle_Info *SInfo;
  uint local_38;
  int line;
  int ret;
  int cVariables_local;
  char **NewVal_const_local;
  char **VarName_const_local;
  char *ServName_const_local;
  char *DevID_const_local;
  UpnpDevice_Handle Hnd_local;
  
  local_38 = 0;
  SInfo._4_4_ = 0;
  DevID = (char *)0x0;
  line = cVariables;
  _ret = NewVal_const;
  NewVal_const_local = VarName_const;
  VarName_const_local = (char **)ServName_const;
  ServName_const_local = DevID_const;
  DevID_const_local._4_4_ = Hnd;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xa9b,"Inside UpnpAcceptSubscription\n");
  if (UpnpSdkInit == 1) {
    HandleReadLock(".upnp/src/api/upnpapi.c",0xaa4);
    UVar1 = GetHandleInfo(DevID_const_local._4_4_,(Handle_Info **)&DevID);
    if (UVar1 == HND_DEVICE) {
      if (DevID_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xab0);
        SInfo._4_4_ = 0xab1;
        local_38 = 0xffffff9b;
      }
      else if (ServName_const == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xab6);
        SInfo._4_4_ = 0xab7;
        local_38 = 0xffffff9b;
      }
      else if (SubsId == (char *)0x0) {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xabc);
        SInfo._4_4_ = 0xabd;
        local_38 = 0xffffff9b;
      }
      else {
        HandleUnlock(".upnp/src/api/upnpapi.c",0xacc);
        SInfo._4_4_ = 0xace;
        local_38 = genaInitNotify(DevID_const_local._4_4_,DevID_const,ServName_const,VarName_const,
                                  NewVal_const,line,SubsId);
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xaaa);
      SInfo._4_4_ = 0xaab;
      local_38 = 0xffffff9c;
    }
  }
  else {
    SInfo._4_4_ = 0xa9f;
    local_38 = 0xffffff8c;
  }
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",SInfo._4_4_,
             "Exiting UpnpAcceptSubscription, ret = %d\n",(ulong)local_38);
  return local_38;
}

Assistant:

int UpnpAcceptSubscription(UpnpDevice_Handle Hnd,
	const char *DevID_const,
	const char *ServName_const,
	const char **VarName_const,
	const char **NewVal_const,
	int cVariables,
	const Upnp_SID SubsId)
{
	int ret = 0;
	int line = 0;
	struct Handle_Info *SInfo = NULL;
	char *DevID = (char *)DevID_const;
	char *ServName = (char *)ServName_const;
	char **VarName = (char **)VarName_const;
	char **NewVal = (char **)NewVal_const;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpAcceptSubscription\n");

	if (UpnpSdkInit != 1) {
		line = __LINE__;
		ret = UPNP_E_FINISH;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);

	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	if (DevID == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (ServName == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	if (SubsId == NULL) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		/* Now accepts an empty state list, so the code below is
		 * commented out */
		#if 0
	if (VarName == NULL || NewVal == NULL || cVariables < 0) {
		HandleUnlock(__FILE__, __LINE__);
		line = __LINE__;
		ret = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
		#endif

	HandleUnlock(__FILE__, __LINE__);

	line = __LINE__;
	ret = genaInitNotify(
		Hnd, DevID, ServName, VarName, NewVal, cVariables, SubsId);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		line,
		"Exiting UpnpAcceptSubscription, ret = %d\n",
		ret);

	return ret;
}